

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [32];
  int iVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar19 [32];
  __m256 afVar18;
  undefined1 auVar30 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 in_XMM12 [16];
  __m128 afVar49;
  unary_op_tanh op;
  unary_op_tanh local_a9;
  Mat *local_a8;
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  __m256 local_80 [2];
  
  local_a8 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx[-3])) {
  case 0:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar17._16_4_ = 0x7fffffff;
    auVar17._20_4_ = 0x7fffffff;
    auVar17._24_4_ = 0x7fffffff;
    auVar17._28_4_ = 0x7fffffff;
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = vandps_avx(auVar17,*pauVar10);
        *pauVar10 = auVar19;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = vandps_avx(auVar31,*(undefined1 (*) [16])*pauVar10);
        *(undefined1 (*) [16])*pauVar10 = auVar32;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar32 = vandps_avx(ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)),auVar31);
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar32._0_4_;
      }
    }
    break;
  case 1:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = *pauVar10;
        auVar34._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
        auVar34._8_4_ = auVar19._8_4_ ^ 0x80000000;
        auVar34._12_4_ = auVar19._12_4_ ^ 0x80000000;
        auVar34._16_4_ = auVar19._16_4_ ^ 0x80000000;
        auVar34._20_4_ = auVar19._20_4_ ^ 0x80000000;
        auVar34._24_4_ = auVar19._24_4_ ^ 0x80000000;
        auVar34._28_4_ = auVar19._28_4_ ^ 0x80000000;
        *pauVar10 = auVar34;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = *(undefined1 (*) [16])*pauVar10;
        auVar33._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar33._12_4_ = auVar32._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar10 = auVar33;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        *(uint *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             *(uint *)((long)pvVar3 + lVar12 * 4 + lVar7) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = vroundps_avx(*pauVar10,1);
        *pauVar10 = auVar19;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = vroundps_avx(*(undefined1 (*) [16])*pauVar10,1);
        *(undefined1 (*) [16])*pauVar10 = auVar32;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar32 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)),
                               9);
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar32._0_4_;
      }
    }
    break;
  case 3:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = vroundps_avx(*pauVar10,2);
        *pauVar10 = auVar19;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = vroundps_avx(*(undefined1 (*) [16])*pauVar10,2);
        *(undefined1 (*) [16])*pauVar10 = auVar32;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar32 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)),
                               10);
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar32._0_4_;
      }
    }
    break;
  case 4:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar5._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar10 + 4);
        auVar5._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar10;
        auVar5._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar10 + 8);
        auVar5._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar10 + 0xc);
        auVar5._16_4_ = *(float *)(*pauVar10 + 0x10) * *(float *)(*pauVar10 + 0x10);
        auVar5._20_4_ = *(float *)(*pauVar10 + 0x14) * *(float *)(*pauVar10 + 0x14);
        auVar5._24_4_ = *(float *)(*pauVar10 + 0x18) * *(float *)(*pauVar10 + 0x18);
        auVar5._28_4_ = *(undefined4 *)(*pauVar10 + 0x1c);
        *pauVar10 = auVar5;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar16._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar10;
        auVar16._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar10 + 4);
        auVar16._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar10 + 8);
        auVar16._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar10 + 0xc);
        *(undefined1 (*) [16])*pauVar10 = auVar16;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15 * fVar15;
      }
    }
    break;
  case 5:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar35._16_4_ = 0x7fffffff;
    auVar35._20_4_ = 0x7fffffff;
    auVar35._24_4_ = 0x7fffffff;
    auVar35._28_4_ = 0x7fffffff;
    auVar39._8_4_ = 0x800000;
    auVar39._0_8_ = 0x80000000800000;
    auVar39._12_4_ = 0x800000;
    auVar39._16_4_ = 0x800000;
    auVar39._20_4_ = 0x800000;
    auVar39._24_4_ = 0x800000;
    auVar39._28_4_ = 0x800000;
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar41._8_4_ = 0x800000;
    auVar41._0_8_ = 0x80000000800000;
    auVar41._12_4_ = 0x800000;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = *pauVar10;
        auVar4 = vrsqrtps_avx(auVar19);
        fVar15 = auVar19._0_4_ * auVar4._0_4_;
        fVar43 = auVar19._4_4_ * auVar4._4_4_;
        fVar44 = auVar19._8_4_ * auVar4._8_4_;
        fVar45 = auVar19._12_4_ * auVar4._12_4_;
        fVar46 = auVar19._16_4_ * auVar4._16_4_;
        fVar47 = auVar19._20_4_ * auVar4._20_4_;
        fVar48 = auVar19._24_4_ * auVar4._24_4_;
        auVar6._4_4_ = fVar43 * -0.5 * (fVar43 * auVar4._4_4_ + -3.0);
        auVar6._0_4_ = fVar15 * -0.5 * (fVar15 * auVar4._0_4_ + -3.0);
        auVar6._8_4_ = fVar44 * -0.5 * (fVar44 * auVar4._8_4_ + -3.0);
        auVar6._12_4_ = fVar45 * -0.5 * (fVar45 * auVar4._12_4_ + -3.0);
        auVar6._16_4_ = fVar46 * -0.5 * (fVar46 * auVar4._16_4_ + -3.0);
        auVar6._20_4_ = fVar47 * -0.5 * (fVar47 * auVar4._20_4_ + -3.0);
        auVar6._24_4_ = fVar48 * -0.5 * (fVar48 * auVar4._24_4_ + -3.0);
        auVar6._28_4_ = auVar4._28_4_ + -3.0;
        auVar19 = vandps_avx(auVar19,auVar35);
        auVar19 = vcmpps_avx(auVar39,auVar19,2);
        auVar19 = vandps_avx(auVar19,auVar6);
        *pauVar10 = auVar19;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = *(undefined1 (*) [16])*pauVar10;
        auVar37 = vrsqrtps_avx(auVar32);
        fVar15 = auVar32._0_4_ * auVar37._0_4_;
        fVar43 = auVar32._4_4_ * auVar37._4_4_;
        fVar44 = auVar32._8_4_ * auVar37._8_4_;
        fVar45 = auVar32._12_4_ * auVar37._12_4_;
        auVar42._0_4_ = fVar15 * -0.5 * (fVar15 * auVar37._0_4_ + -3.0);
        auVar42._4_4_ = fVar43 * -0.5 * (fVar43 * auVar37._4_4_ + -3.0);
        auVar42._8_4_ = fVar44 * -0.5 * (fVar44 * auVar37._8_4_ + -3.0);
        auVar42._12_4_ = fVar45 * -0.5 * (fVar45 * auVar37._12_4_ + -3.0);
        auVar32 = vandps_avx(auVar32,auVar40);
        auVar32 = vcmpps_avx(auVar41,auVar32,2);
        auVar32 = vandps_avx(auVar32,auVar42);
        *(undefined1 (*) [16])*pauVar10 = auVar32;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar32 = vsqrtss_avx(in_XMM12,ZEXT416(*(uint *)((long)pvVar3 + lVar12 * 4 + lVar7)));
        *(int *)((long)pvVar3 + lVar12 * 4 + lVar7) = auVar32._0_4_;
      }
    }
    break;
  case 6:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar19 = vrsqrtps_avx(*pauVar10);
        *pauVar10 = auVar19;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar32 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar10);
        *(undefined1 (*) [16])*pauVar10 = auVar32;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
        auVar32 = vrsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        fVar43 = auVar32._0_4_;
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             fVar43 * -0.5 * (fVar15 * fVar43 * fVar43 + -3.0);
      }
    }
    break;
  case 7:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_exp::func_pack8((unary_op_exp *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_a9,(__m128 *)local_80);
        auVar25._0_8_ = afVar49._0_8_;
        auVar25._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar25._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = expf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 8:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_log::func_pack8((unary_op_log *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_a9,(__m128 *)local_80);
        auVar29._0_8_ = afVar49._0_8_;
        auVar29._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar29._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = logf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 9:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_sin::func_pack8((unary_op_sin *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_a9,(__m128 *)local_80);
        auVar24._0_8_ = afVar49._0_8_;
        auVar24._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar24._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = sinf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 10:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_cos::func_pack8((unary_op_cos *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_a9,(__m128 *)local_80);
        auVar28._0_8_ = afVar49._0_8_;
        auVar28._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar28._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = cosf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0xb:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_tan::func_pack8((unary_op_tan *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_a9,(__m128 *)local_80);
        auVar22._0_8_ = afVar49._0_8_;
        auVar22._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar22._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = tanf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0xc:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_asin::func_pack8((unary_op_asin *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_a9,(__m128 *)local_80);
        auVar23._0_8_ = afVar49._0_8_;
        auVar23._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar23._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = asinf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0xd:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_acos::func_pack8((unary_op_acos *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_a9,(__m128 *)local_80);
        auVar27._0_8_ = afVar49._0_8_;
        auVar27._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar27._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = acosf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0xe:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_atan::func_pack8((unary_op_atan *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_a9,(__m128 *)local_80);
        auVar21._0_8_ = afVar49._0_8_;
        auVar21._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar21._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = atanf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0xf:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar19._16_4_ = 0x3f800000;
    auVar19._20_4_ = 0x3f800000;
    auVar19._24_4_ = 0x3f800000;
    auVar19._28_4_ = 0x3f800000;
    auVar32._8_4_ = 0x3f800000;
    auVar32._0_8_ = 0x3f8000003f800000;
    auVar32._12_4_ = 0x3f800000;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar2 * uVar9 * sVar1 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar35 = *pauVar10;
        auVar39 = vrcpps_avx(auVar35);
        fVar15 = auVar39._0_4_;
        fVar43 = auVar39._4_4_;
        auVar4._4_4_ = auVar35._4_4_ * fVar43;
        auVar4._0_4_ = auVar35._0_4_ * fVar15;
        fVar44 = auVar39._8_4_;
        auVar4._8_4_ = auVar35._8_4_ * fVar44;
        fVar45 = auVar39._12_4_;
        auVar4._12_4_ = auVar35._12_4_ * fVar45;
        fVar46 = auVar39._16_4_;
        auVar4._16_4_ = auVar35._16_4_ * fVar46;
        fVar47 = auVar39._20_4_;
        auVar4._20_4_ = auVar35._20_4_ * fVar47;
        fVar48 = auVar39._24_4_;
        auVar4._24_4_ = auVar35._24_4_ * fVar48;
        auVar4._28_4_ = auVar35._28_4_;
        auVar35 = vsubps_avx(auVar19,auVar4);
        auVar38._0_4_ = fVar15 + fVar15 * auVar35._0_4_;
        auVar38._4_4_ = fVar43 + fVar43 * auVar35._4_4_;
        auVar38._8_4_ = fVar44 + fVar44 * auVar35._8_4_;
        auVar38._12_4_ = fVar45 + fVar45 * auVar35._12_4_;
        auVar38._16_4_ = fVar46 + fVar46 * auVar35._16_4_;
        auVar38._20_4_ = fVar47 + fVar47 * auVar35._20_4_;
        auVar38._24_4_ = fVar48 + fVar48 * auVar35._24_4_;
        auVar38._28_4_ = auVar39._28_4_ + auVar35._28_4_;
        *pauVar10 = auVar38;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar40 = *(undefined1 (*) [16])*pauVar10;
        auVar37 = vrcpps_avx(auVar40);
        fVar15 = auVar37._0_4_;
        auVar36._0_4_ = auVar40._0_4_ * fVar15;
        fVar43 = auVar37._4_4_;
        auVar36._4_4_ = auVar40._4_4_ * fVar43;
        fVar44 = auVar37._8_4_;
        auVar36._8_4_ = auVar40._8_4_ * fVar44;
        fVar45 = auVar37._12_4_;
        auVar36._12_4_ = auVar40._12_4_ * fVar45;
        auVar40 = vsubps_avx(auVar32,auVar36);
        auVar37._0_4_ = fVar15 + fVar15 * auVar40._0_4_;
        auVar37._4_4_ = fVar43 + fVar43 * auVar40._4_4_;
        auVar37._8_4_ = fVar44 + fVar44 * auVar40._8_4_;
        auVar37._12_4_ = fVar45 + fVar45 * auVar40._12_4_;
        *(undefined1 (*) [16])*pauVar10 = auVar37;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar2 * sVar1 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) =
             1.0 / *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 0x10:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_tanh::func_pack8(&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_tanh::func_pack4(&local_a9,(__m128 *)local_80);
        auVar20._0_8_ = afVar49._0_8_;
        auVar20._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar20._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = tanhf(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
    break;
  case 0x11:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar13 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar18 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_log10::func_pack8((unary_op_log10 *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar18;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; uVar8 = local_88, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar30 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar49 = UnaryOp_x86_avx_functor::unary_op_log10::func_pack4
                            ((unary_op_log10 *)&local_a9,(__m128 *)local_80);
        auVar26._0_8_ = afVar49._0_8_;
        auVar26._8_56_ = auVar30;
        *(undefined1 (*) [16])pfVar13 = auVar26._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_90 * local_98 * local_88;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = log10f(*(float *)((long)pvVar3 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_88 = uVar8 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}